

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeChangeP4(Vdbe *p,int addr,char *zP4,int n)

{
  sqlite3 *db_00;
  Op *pOVar1;
  void *__src;
  int n_00;
  uint uVar2;
  VdbeFunc *__dest;
  char *pcVar3;
  u8 *aSortOrder;
  int nByte;
  int nField;
  KeyInfo *pKeyInfo;
  sqlite3 *db;
  Op *pOp;
  int n_local;
  char *zP4_local;
  int addr_local;
  Vdbe *p_local;
  
  db_00 = p->db;
  if ((p->aOp == (Op *)0x0) || (db_00->mallocFailed != '\0')) {
    if ((n != -6) && (n != -10)) {
      freeP4(db_00,n,zP4);
    }
  }
  else {
    zP4_local._4_4_ = addr;
    if (addr < 0) {
      zP4_local._4_4_ = p->nOp + -1;
    }
    pOVar1 = p->aOp;
    freeP4(db_00,(int)pOVar1[zP4_local._4_4_].p4type,pOVar1[zP4_local._4_4_].p4.p);
    pOVar1[zP4_local._4_4_].p4.p = (void *)0x0;
    if (n == -0xe) {
      pOVar1[zP4_local._4_4_].p4.i = (int)zP4;
      pOVar1[zP4_local._4_4_].p4type = -0xe;
    }
    else if (zP4 == (char *)0x0) {
      pOVar1[zP4_local._4_4_].p4.p = (void *)0x0;
      pOVar1[zP4_local._4_4_].p4type = '\0';
    }
    else if (n == -6) {
      uVar2 = (uint)*(ushort *)(zP4 + 10);
      n_00 = uVar2 * 9 + 0x18;
      __dest = (VdbeFunc *)sqlite3DbMallocRaw((sqlite3 *)0x0,n_00);
      pOVar1[zP4_local._4_4_].p4.pVdbeFunc = __dest;
      if (__dest == (VdbeFunc *)0x0) {
        p->db->mallocFailed = '\x01';
        pOVar1[zP4_local._4_4_].p4type = '\0';
      }
      else {
        memcpy(__dest,zP4,(long)(int)(n_00 - uVar2));
        __src = __dest->apAux[0].pAux;
        __dest->apAux[0].pAux = &__dest->apAux[0].xDelete + (int)uVar2;
        memcpy(__dest->apAux[0].pAux,__src,(long)(int)uVar2);
        pOVar1[zP4_local._4_4_].p4type = -6;
      }
    }
    else if (n == -0x10) {
      pOVar1[zP4_local._4_4_].p4.z = zP4;
      pOVar1[zP4_local._4_4_].p4type = -6;
    }
    else if (n == -10) {
      pOVar1[zP4_local._4_4_].p4.z = zP4;
      pOVar1[zP4_local._4_4_].p4type = -10;
      sqlite3VtabLock((VTable *)zP4);
    }
    else if (n < 0) {
      pOVar1[zP4_local._4_4_].p4.z = zP4;
      pOVar1[zP4_local._4_4_].p4type = (char)n;
    }
    else {
      pOp._4_4_ = n;
      if (n == 0) {
        pOp._4_4_ = sqlite3Strlen30(zP4);
      }
      pcVar3 = sqlite3DbStrNDup(p->db,zP4,pOp._4_4_);
      pOVar1[zP4_local._4_4_].p4.z = pcVar3;
      pOVar1[zP4_local._4_4_].p4type = -1;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeChangeP4(Vdbe *p, int addr, const char *zP4, int n){
  Op *pOp;
  sqlite3 *db;
  assert( p!=0 );
  db = p->db;
  assert( p->magic==VDBE_MAGIC_INIT );
  if( p->aOp==0 || db->mallocFailed ){
    if ( n!=P4_KEYINFO && n!=P4_VTAB ) {
      freeP4(db, n, (void*)*(char**)&zP4);
    }
    return;
  }
  assert( p->nOp>0 );
  assert( addr<p->nOp );
  if( addr<0 ){
    addr = p->nOp - 1;
  }
  pOp = &p->aOp[addr];
  assert( pOp->p4type==P4_NOTUSED || pOp->p4type==P4_INT32 );
  freeP4(db, pOp->p4type, pOp->p4.p);
  pOp->p4.p = 0;
  if( n==P4_INT32 ){
    /* Note: this cast is safe, because the origin data point was an int
    ** that was cast to a (const char *). */
    pOp->p4.i = SQLITE_PTR_TO_INT(zP4);
    pOp->p4type = P4_INT32;
  }else if( zP4==0 ){
    pOp->p4.p = 0;
    pOp->p4type = P4_NOTUSED;
  }else if( n==P4_KEYINFO ){
    KeyInfo *pKeyInfo;
    int nField, nByte;

    nField = ((KeyInfo*)zP4)->nField;
    nByte = sizeof(*pKeyInfo) + (nField-1)*sizeof(pKeyInfo->aColl[0]) + nField;
    pKeyInfo = sqlite3DbMallocRaw(0, nByte);
    pOp->p4.pKeyInfo = pKeyInfo;
    if( pKeyInfo ){
      u8 *aSortOrder;
      memcpy((char*)pKeyInfo, zP4, nByte - nField);
      aSortOrder = pKeyInfo->aSortOrder;
      assert( aSortOrder!=0 );
      pKeyInfo->aSortOrder = (unsigned char*)&pKeyInfo->aColl[nField];
      memcpy(pKeyInfo->aSortOrder, aSortOrder, nField);
      pOp->p4type = P4_KEYINFO;
    }else{
      p->db->mallocFailed = 1;
      pOp->p4type = P4_NOTUSED;
    }
  }else if( n==P4_KEYINFO_HANDOFF ){
    pOp->p4.p = (void*)zP4;
    pOp->p4type = P4_KEYINFO;
  }else if( n==P4_VTAB ){
    pOp->p4.p = (void*)zP4;
    pOp->p4type = P4_VTAB;
    sqlite3VtabLock((VTable *)zP4);
    assert( ((VTable *)zP4)->db==p->db );
  }else if( n<0 ){
    pOp->p4.p = (void*)zP4;
    pOp->p4type = (signed char)n;
  }else{
    if( n==0 ) n = sqlite3Strlen30(zP4);
    pOp->p4.z = sqlite3DbStrNDup(p->db, zP4, n);
    pOp->p4type = P4_DYNAMIC;
  }
}